

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<(anonymous_namespace)::ButtonInfo>::moveAppend
          (QGenericArrayOps<(anonymous_namespace)::ButtonInfo> *this,ButtonInfo *b,ButtonInfo *e)

{
  ButtonInfo *this_00;
  ulong in_RDX;
  ulong in_RSI;
  ButtonInfo *in_RDI;
  ButtonInfo *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::begin
                        ((QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)0x4477e3);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      anon_unknown.dwarf_477e63::ButtonInfo::ButtonInfo(this_00,in_RDI);
      local_10 = local_10 + 0x98;
      *(long *)&(in_RDI->rule).font = *(long *)&(in_RDI->rule).font + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }